

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.cc
# Opt level: O0

void __thiscall flow::PassManager::run(PassManager *this,IRProgram *program)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  element_type *local_48;
  IRHandler *handler;
  iterator __end1;
  iterator __begin1;
  UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  *__range1;
  IRProgram *program_local;
  PassManager *this_local;
  
  ___begin1 = IRProgram::handlers(program);
  __end1 = util::
           UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
           ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
                    *)&__begin1);
  handler = (IRHandler *)
            util::
            UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
            ::end((UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
                   *)&__begin1);
  while( true ) {
    bVar1 = util::
            UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
            ::iterator::operator!=(&__end1,(iterator *)&handler);
    if (!bVar1) break;
    local_48 = util::
               UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
               ::iterator::operator*(&__end1);
    psVar2 = Value::name_abi_cxx11_((Value *)local_48);
    std::__cxx11::string::string((string *)&local_68,(string *)psVar2);
    logDebug<std::__cxx11::string>(this,"optimizing handler {}",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    run(this,local_48);
    util::
    UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
    ::iterator::operator++(&__end1);
  }
  return;
}

Assistant:

void PassManager::run(IRProgram* program) {
  for (IRHandler* handler : program->handlers()) {
    logDebug("optimizing handler {}", handler->name());
    run(handler);
  }
}